

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_persistence_matrix_field_operators.cpp
# Opt level: O2

void test_z5_standart_field_properties<Gudhi::persistence_fields::Zp_field_operators<unsigned_int,void>>
               (Zp_field_operators<unsigned_int,_void> *op)

{
  uint uVar1;
  Zp_field_operators<unsigned_int,_void> *pZVar2;
  ulong uVar3;
  char *local_260;
  char *local_258;
  uint local_250 [2];
  undefined8 local_248;
  shared_count sStack_240;
  undefined **local_238;
  undefined1 local_230;
  undefined8 *local_228;
  char **local_220;
  Zp_field_operators<unsigned_int,_void> *local_218;
  char *local_210;
  char *local_208;
  char *local_200;
  char *local_1f8;
  char *local_1f0;
  char *local_1e8;
  char *local_1e0;
  char *local_1d8;
  undefined1 *local_1d0;
  undefined1 *local_1c8;
  char *local_1c0;
  char *local_1b8;
  undefined1 *local_1b0;
  undefined1 *local_1a8;
  char *local_1a0;
  char *local_198;
  char *local_190;
  char *local_188;
  undefined1 *local_180;
  undefined1 *local_178;
  char *local_170;
  char *local_168;
  char *local_160;
  char *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  char *local_140;
  char *local_138;
  char *local_130;
  char *local_128;
  undefined1 *local_120;
  undefined1 *local_118;
  char *local_110;
  char *local_108;
  char *local_100;
  char *local_f8;
  undefined1 *local_f0;
  undefined1 *local_e8;
  char *local_e0;
  char *local_d8;
  char *local_d0;
  char *local_c8;
  undefined1 *local_c0;
  undefined1 *local_b8;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  char *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  char *local_80;
  char *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x149);
  local_230 = 0;
  local_238 = &PTR__lazy_ostream_00118ce8;
  local_228 = &boost::unit_test::lazy_ostream::inst;
  local_220 = (char **)0x112044;
  local_1e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_1d8 = "";
  if (op->characteristic_ < 8) {
    uVar3 = (ulong)(byte)(7 % (byte)op->characteristic_);
  }
  else {
    uVar3 = 7;
  }
  local_250[0] = (op->inverse_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar3];
  local_260._0_4_ = 3;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
            (&local_238,&local_1e0,0x149,1,2,local_250,"op.get_inverse(z51)",&local_260,"3");
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_58 = "";
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_60,0x14a);
  local_230 = 0;
  local_238 = &PTR__lazy_ostream_00118ce8;
  local_228 = &boost::unit_test::lazy_ostream::inst;
  local_220 = (char **)0x112044;
  local_1f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_1e8 = "";
  if (op->characteristic_ < 4) {
    uVar3 = (ulong)(byte)(3 % (byte)op->characteristic_);
  }
  else {
    uVar3 = 3;
  }
  local_250[0] = (op->inverse_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar3];
  local_260 = (char *)CONCAT44(local_260._4_4_,2);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
            (&local_238,&local_1f0,0x14a,1,2,local_250,"op.get_inverse(z52)",&local_260,"2");
  local_80 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_78 = "";
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_80,0x14b);
  if (op->characteristic_ < 8) {
    uVar3 = (ulong)(byte)(7 % (byte)op->characteristic_);
  }
  else {
    uVar3 = 7;
  }
  local_248 = 0;
  sStack_240.pi_ = (sp_counted_base *)0x0;
  local_260 = "op.get_partial_inverse(z51, 35) == std::make_pair(3u, 35u)";
  local_258 = "";
  local_230 = 0;
  local_238 = &PTR__lazy_ostream_00118d68;
  local_228 = &boost::unit_test::lazy_ostream::inst;
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_98 = "";
  local_220 = &local_260;
  local_250[0]._0_1_ =
       (op->inverse_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start[uVar3] == 3;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_240);
  local_b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_a8 = "";
  local_c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_b0,0x14c);
  if (op->characteristic_ < 4) {
    uVar3 = (ulong)(byte)(3 % (byte)op->characteristic_);
  }
  else {
    uVar3 = 3;
  }
  local_250[0] = CONCAT31(local_250[0]._1_3_,
                          (op->inverse_).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar3] == 2);
  local_248 = 0;
  sStack_240.pi_ = (sp_counted_base *)0x0;
  local_260 = "op.get_partial_inverse(z52, 35) == std::make_pair(2u, 35u)";
  local_258 = "";
  local_230 = 0;
  local_238 = &PTR__lazy_ostream_00118d68;
  local_228 = &boost::unit_test::lazy_ostream::inst;
  local_d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_c8 = "";
  local_220 = &local_260;
  boost::test_tools::tt_detail::report_assertion();
  local_218 = op;
  boost::detail::shared_count::~shared_count(&sStack_240);
  local_e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_d8 = "";
  local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_e0,0x14e);
  local_230 = 0;
  local_238 = &PTR__lazy_ostream_00118ce8;
  local_228 = &boost::unit_test::lazy_ostream::inst;
  local_220 = (char **)0x112044;
  local_100 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_250[0] = 0;
  local_f8 = "";
  local_260 = (char *)((ulong)local_260 & 0xffffffff00000000);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
            (&local_238,&local_100,0x14e,1,2,local_250,"op.get_additive_identity()",&local_260,"0");
  local_110 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_108 = "";
  local_120 = &boost::unit_test::basic_cstring<char_const>::null;
  local_118 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_110,0x150);
  local_230 = 0;
  local_238 = &PTR__lazy_ostream_00118ce8;
  local_228 = &boost::unit_test::lazy_ostream::inst;
  local_220 = (char **)0x112044;
  local_130 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_128 = "";
  local_260._0_4_ = 1;
  local_250[0] = 1;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
            (&local_238,&local_130,0x150,1,2,local_250,"op.get_multiplicative_identity()",&local_260
             ,"1");
  local_140 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_138 = "";
  local_150 = &boost::unit_test::basic_cstring<char_const>::null;
  local_148 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_140,0x151);
  local_230 = 0;
  local_238 = &PTR__lazy_ostream_00118ce8;
  local_228 = &boost::unit_test::lazy_ostream::inst;
  local_220 = (char **)0x112044;
  local_160 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_158 = "";
  local_260._0_4_ = 1;
  local_250[0] = 1;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
            (&local_238,&local_160,0x151,1,2,local_250,"op.get_partial_multiplicative_identity(35)",
             &local_260,"1");
  local_170 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_168 = "";
  local_180 = &boost::unit_test::basic_cstring<char_const>::null;
  local_178 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_170,0x153);
  pZVar2 = local_218;
  local_230 = 0;
  local_238 = &PTR__lazy_ostream_00118ce8;
  local_228 = &boost::unit_test::lazy_ostream::inst;
  local_220 = (char **)0x112044;
  local_190 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_188 = "";
  local_250[0] = 5;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
            (&local_238,&local_190,0x153,1,2,local_218,"op.get_characteristic()",local_250,"5");
  local_1a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_198 = "";
  local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1a0,0x155);
  local_230 = 0;
  local_238 = &PTR__lazy_ostream_00118ce8;
  local_228 = &boost::unit_test::lazy_ostream::inst;
  local_220 = (char **)0x112044;
  local_200 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_1f8 = "";
  uVar1 = pZVar2->characteristic_;
  if (uVar1 < 8) {
    local_250[0] = (uint)(byte)(7 % (byte)uVar1);
  }
  else {
    local_250[0] = 7;
  }
  local_260._0_4_ = 2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
            (&local_238,&local_200,0x155,1,2,local_250,"op.get_value(z51)",&local_260,"2");
  local_1c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_1b8 = "";
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1c0,0x156);
  local_230 = 0;
  local_238 = &PTR__lazy_ostream_00118ce8;
  local_228 = &boost::unit_test::lazy_ostream::inst;
  local_220 = (char **)0x112044;
  local_210 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_field_operators.cpp"
  ;
  local_208 = "";
  uVar1 = pZVar2->characteristic_;
  if (uVar1 < 4) {
    local_250[0] = (uint)(byte)(3 % (byte)uVar1);
  }
  else {
    local_250[0] = 3;
  }
  local_260 = (char *)CONCAT44(local_260._4_4_,3);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
            (&local_238,&local_210,0x156,1,2,local_250,"op.get_value(z52)",&local_260,"3");
  return;
}

Assistant:

void test_z5_standart_field_properties(Z5& op) {
  unsigned int z51 = 7;
  unsigned int z52 = 3;

  BOOST_CHECK_EQUAL(op.get_inverse(z51), 3);
  BOOST_CHECK_EQUAL(op.get_inverse(z52), 2);
  BOOST_CHECK(op.get_partial_inverse(z51, 35) == std::make_pair(3u, 35u));
  BOOST_CHECK(op.get_partial_inverse(z52, 35) == std::make_pair(2u, 35u));

  BOOST_CHECK_EQUAL(op.get_additive_identity(), 0);

  BOOST_CHECK_EQUAL(op.get_multiplicative_identity(), 1);
  BOOST_CHECK_EQUAL(op.get_partial_multiplicative_identity(35), 1);

  BOOST_CHECK_EQUAL(op.get_characteristic(), 5);

  BOOST_CHECK_EQUAL(op.get_value(z51), 2);
  BOOST_CHECK_EQUAL(op.get_value(z52), 3);
}